

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_shell.c
# Opt level: O0

int main(void)

{
  undefined1 local_bb0 [8];
  nsh_t nsh;
  nsh_status_t status;
  
  nsh.current_history_entry = 0;
  enableRawMode();
  nsh.history.size = 0;
  nsh_init((nsh_t *)local_bb0,&nsh.history.size);
  nsh_register_command((nsh_t *)local_bb0,"null",(nsh_cmd_handler_t *)0x0);
  nsh_run((nsh_t *)local_bb0);
  return 0;
}

Assistant:

int main(void)
{
    enableRawMode();
    // setvbuf(stdin, NULL, _IONBF, 0);
    // setvbuf(stdout, NULL, _IONBF, 0);
    nsh_status_t status = NSH_STATUS_OK;
    nsh_t nsh = nsh_init(&status);            // status intentionally ignored
    nsh_register_command(&nsh, "null", NULL); // NSH_NON_NULL precondition not satisfied
    nsh_run(&nsh);
    return 0;
}